

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O3

void __thiscall ProblemTest_AddCommonExprs_Test::TestBody(ProblemTest_AddCommonExprs_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  Problem p;
  Message local_380;
  AssertHelper local_378;
  internal local_370 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  BasicProblem<mp::BasicProblemParams<int>_> local_360;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_360);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddVars(&local_360,1,CONTINUOUS);
  local_380.ss_.ptr_._0_4_ = 0;
  local_378.data_._0_4_ =
       (int)((ulong)((long)local_360.linear_exprs_.
                           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_360.linear_exprs_.
                          super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
  testing::internal::CmpHelperEQ<int,int>
            (local_370,"0","p.num_common_exprs()",(int *)&local_380,(int *)&local_378);
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message(&local_380);
    if (local_368.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_368.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x212,pcVar2);
    testing::internal::AssertHelper::operator=(&local_378,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (CONCAT44(local_380.ss_.ptr_._4_4_,local_380.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_380.ss_.ptr_._4_4_,local_380.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_380.ss_.ptr_._4_4_,local_380.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_368,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCommonExprs(&local_360,2);
  local_380.ss_.ptr_._0_4_ = 2;
  local_378.data_._0_4_ =
       (int)((ulong)((long)local_360.linear_exprs_.
                           super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_360.linear_exprs_.
                          super__Vector_base<mp::LinearExpr,_std::allocator<mp::LinearExpr>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11111111;
  testing::internal::CmpHelperEQ<int,int>
            (local_370,"2","p.num_common_exprs()",(int *)&local_380,(int *)&local_378);
  if (local_370[0] == (internal)0x0) {
    testing::Message::Message(&local_380);
    if (local_368.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_368.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
               0x214,pcVar2);
    testing::internal::AssertHelper::operator=(&local_378,&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (CONCAT44(local_380.ss_.ptr_._4_4_,local_380.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_380.ss_.ptr_._4_4_,local_380.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_380.ss_.ptr_._4_4_,local_380.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_368,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_360);
  return;
}

Assistant:

TEST(ProblemTest, AddCommonExprs) {
  Problem p;
  p.AddVars(1, mp::var::CONTINUOUS);
  EXPECT_EQ(0, p.num_common_exprs());
  p.AddCommonExprs(2);
  EXPECT_EQ(2, p.num_common_exprs());
}